

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O1

float core::image::desaturate_lightness<float>(float *v)

{
  float *pfVar1;
  float *__result;
  float *pfVar2;
  long lVar3;
  float *pfVar4;
  
  lVar3 = 4;
  pfVar2 = v;
  do {
    if (*pfVar2 <= *(float *)((long)v + lVar3) && *(float *)((long)v + lVar3) != *pfVar2) {
      pfVar2 = (float *)((long)v + lVar3);
    }
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0xc);
  lVar3 = 0;
  pfVar4 = v;
  do {
    pfVar1 = (float *)((long)v + lVar3 + 4);
    if (*pfVar1 <= *pfVar4 && *pfVar4 != *pfVar1) {
      pfVar4 = (float *)((long)v + lVar3 + 4);
    }
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  return *pfVar2 * 0.5 + *pfVar4 * 0.5;
}

Assistant:

inline T
desaturate_lightness (T const* v)
{
    T const* max = std::max_element(v, v + 3);
    T const* min = std::min_element(v, v + 3);
    return math::interpolate(*max, *min, 0.5f, 0.5f);
}